

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_allocate_invocation_id(Impl *this,SPIRVModule *module)

{
  Id IVar1;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (this->allocate_invocation_id_call_id == 0) {
    IVar1 = build_allocate_invocation_id_function
                      (module,(this->instruction_instrumentation).info.control_desc_set,
                       (this->instruction_instrumentation).info.control_binding);
    this->allocate_invocation_id_call_id = IVar1;
  }
  return this->allocate_invocation_id_call_id;
}

Assistant:

spv::Id SPIRVModule::Impl::build_allocate_invocation_id(SPIRVModule &module)
{
	if (!allocate_invocation_id_call_id)
	{
		allocate_invocation_id_call_id = build_allocate_invocation_id_function(
		    module,
		    instruction_instrumentation.info.control_desc_set,
		    instruction_instrumentation.info.control_binding);
	}

	return allocate_invocation_id_call_id;
}